

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

String __thiscall
testing::internal::XmlUnitTestResultPrinter::EscapeXml
          (XmlUnitTestResultPrinter *this,char *str,bool is_attribute)

{
  byte bVar1;
  void *pvVar2;
  XmlUnitTestResultPrinter *pXVar3;
  uint uVar4;
  long lVar5;
  size_t extraout_RDX;
  long lVar7;
  char *pcVar8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sVar9;
  ostream *poVar10;
  String SVar11;
  char local_51;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  byte local_48;
  undefined7 uStack_47;
  long local_40;
  XmlUnitTestResultPrinter *local_38;
  size_t sVar6;
  
  local_38 = this;
  Message::Message((Message *)&local_50);
  if (str == (char *)0x0) {
LAB_00128641:
    pXVar3 = local_38;
    SVar11 = StringStreamToString((internal *)local_38,local_50.ptr_);
    sVar6 = SVar11.length_;
    if (local_50.ptr_ != (stringstream *)0x0) {
      (**(code **)(*(long *)local_50.ptr_ + 8))();
      sVar6 = extraout_RDX;
    }
    SVar11.length_ = sVar6;
    SVar11.c_str_ = (char *)pXVar3;
    return SVar11;
  }
  do {
    bVar1 = *str;
    uVar4 = (uint)bVar1;
    if (bVar1 < 0x27) {
      if (bVar1 == 0x22) {
        sVar9.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_50.ptr_ + 0x10);
        if (local_50.ptr_ ==
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          sVar9.ptr_ = local_50.ptr_;
        }
        lVar5 = 6;
        if (is_attribute) {
          pcVar8 = "&quot;";
          goto LAB_001284f7;
        }
        local_48 = 0x22;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)sVar9.ptr_,(char *)&local_48,1);
      }
      else {
        if (uVar4 == 0x26) {
          sVar9.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_50.ptr_ + 0x10);
          if (local_50.ptr_ ==
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            sVar9.ptr_ = local_50.ptr_;
          }
          lVar5 = 5;
          pcVar8 = "&amp;";
          goto LAB_001284f7;
        }
        if (uVar4 == 0) goto LAB_00128641;
LAB_0012850c:
        if (('\x1f' < (char)bVar1) || ((uVar4 < 0xe && ((0x2600U >> (uVar4 & 0x1f) & 1) != 0)))) {
          if ((is_attribute) && ((uVar4 < 0xe && ((0x2600U >> (uVar4 & 0x1f) & 1) != 0)))) {
            String::Format((char *)&local_48,"&#x%02X;");
            lVar5 = local_40;
            poVar10 = (ostream *)(local_50.ptr_ + 0x10);
            if (local_50.ptr_ ==
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              poVar10 = (ostream *)0x0;
            }
            pvVar2 = (void *)CONCAT71(uStack_47,local_48);
            if (pvVar2 == (void *)0x0) {
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,"(null)",6);
            }
            else {
              if (local_40 != 0) {
                lVar7 = 0;
                do {
                  if (*(char *)((long)pvVar2 + lVar7) == '\0') {
                    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\\0",2);
                  }
                  else {
                    local_51 = *(char *)((long)pvVar2 + lVar7);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar10,&local_51,1);
                  }
                  lVar7 = lVar7 + 1;
                } while (lVar5 != lVar7);
              }
              operator_delete__(pvVar2);
            }
          }
          else {
            poVar10 = (ostream *)(local_50.ptr_ + 0x10);
            if (local_50.ptr_ ==
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              poVar10 = (ostream *)0x0;
            }
            local_48 = bVar1;
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)&local_48,1);
          }
        }
      }
    }
    else {
      if (bVar1 == 0x27) {
        sVar9.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_50.ptr_ + 0x10);
        if (local_50.ptr_ ==
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          sVar9.ptr_ = local_50.ptr_;
        }
        lVar5 = 6;
        if (!is_attribute) {
          local_48 = 0x27;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)sVar9.ptr_,(char *)&local_48,1);
          goto LAB_001284fc;
        }
        pcVar8 = "&apos;";
      }
      else if (uVar4 == 0x3e) {
        sVar9.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_50.ptr_ + 0x10);
        if (local_50.ptr_ ==
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          sVar9.ptr_ = local_50.ptr_;
        }
        lVar5 = 4;
        pcVar8 = "&gt;";
      }
      else {
        if (uVar4 != 0x3c) goto LAB_0012850c;
        sVar9.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_50.ptr_ + 0x10);
        if (local_50.ptr_ ==
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          sVar9.ptr_ = local_50.ptr_;
        }
        lVar5 = 4;
        pcVar8 = "&lt;";
      }
LAB_001284f7:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)sVar9.ptr_,pcVar8,lVar5);
    }
LAB_001284fc:
    str = (char *)((byte *)str + 1);
  } while( true );
}

Assistant:

String XmlUnitTestResultPrinter::EscapeXml(const char* str, bool is_attribute) {
  Message m;

  if (str != NULL) {
    for (const char* src = str; *src; ++src) {
      switch (*src) {
        case '<':
          m << "&lt;";
          break;
        case '>':
          m << "&gt;";
          break;
        case '&':
          m << "&amp;";
          break;
        case '\'':
          if (is_attribute)
            m << "&apos;";
          else
            m << '\'';
          break;
        case '"':
          if (is_attribute)
            m << "&quot;";
          else
            m << '"';
          break;
        default:
          if (IsValidXmlCharacter(*src)) {
            if (is_attribute && IsNormalizableWhitespace(*src))
              m << String::Format("&#x%02X;", unsigned(*src));
            else
              m << *src;
          }
          break;
      }
    }
  }

  return m.GetString();
}